

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O1

void __thiscall PrintfTest_Enum_Test::TestBody(PrintfTest_Enum_Test *this)

{
  bool bVar1;
  char *pcVar2;
  string_view format;
  string_view format_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined1 local_2d0 [32];
  internal local_2b0 [8];
  _Alloc_hider local_2a8;
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  local_2a0;
  string local_268;
  undefined8 local_248 [2];
  undefined1 local_238 [32];
  undefined1 local_218 [504];
  
  local_2d0._0_4_ = 0x2a;
  format.size_ = 2;
  format.data_ = "%d";
  test_sprintf<E>((string *)local_238,format,(E *)local_2d0);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_2a0,"\"42\"","test_sprintf(\"%d\", A)",(char (*) [3])0x207c47,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_);
  }
  if (local_2a0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_238._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_238._0_8_ + 0x10),"%d",2);
    if ((undefined8 *)
        local_2a0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_2a0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1df,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((long *)local_238._0_8_ != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_238._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_238._0_8_ + 8))();
      }
      local_238._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2a0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_00.size_ = 2;
  format_00.data_ = "%d";
  make_positional_abi_cxx11_(&local_268,format_00);
  local_2a0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_248;
  local_248[0] = 0x2a;
  local_238._16_8_ = 0;
  local_238._0_8_ = &PTR_grow_00240f40;
  local_238._24_8_ = 500;
  local_2a0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_268._M_dataplus._M_p;
  local_2a0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_268._M_string_length;
  local_2a0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2a0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,E>
       ::TYPES;
  local_2a0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2a0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_238;
  local_238._8_8_ = local_218;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2a0);
  local_2d0._0_8_ = (AssertHelperData *)(local_2d0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_238._8_8_,(undefined1 *)(local_238._8_8_ + local_238._16_8_))
  ;
  local_238._0_8_ = &PTR_grow_00240f40;
  if ((undefined1 *)local_238._8_8_ != local_218) {
    operator_delete((void *)local_238._8_8_);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_2b0,"\"42\"","fmt::sprintf(make_positional(\"%d\"), A)",(char (*) [3])0x207c47,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != (AssertHelperData *)(local_2d0 + 0x10)) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_2b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_238);
    if (local_2a8._M_p == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_2a8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1df,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((undefined **)local_238._0_8_ != (undefined **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((undefined **)local_238._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_238._0_8_ + 8))();
      }
      local_238._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(PrintfTest, Enum) {
  EXPECT_PRINTF("42", "%d", A);
}